

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O1

void mxx::
     stable_distribute<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out,comm *comm)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  void *pvVar4;
  int iVar5;
  unsigned_long uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  pointer puVar10;
  pointer puVar11;
  ulong uVar12;
  ulong uVar13;
  size_t local_size;
  int result;
  custom_op<unsigned_long> op;
  allocator_type local_91;
  pointer local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  custom_op<unsigned_long> local_70;
  
  if (comm->m_size == 1) {
    if ((long)end._M_current - (long)begin._M_current != 0) {
      memmove(out._M_current,begin._M_current,(long)end._M_current - (long)begin._M_current);
      return;
    }
  }
  else {
    local_90 = (pointer)((long)end._M_current - (long)begin._M_current >> 2);
    custom_op<unsigned_long>::custom_op<std::plus<unsigned_long>>(&local_70,1);
    MPI_Allreduce(&local_90,&local_88,1,local_70.m_type_copy,local_70.m_op,comm->mpi_comm);
    puVar10 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    custom_op<unsigned_long>::~custom_op(&local_70);
    if (puVar10 != (pointer)0x0) {
      local_70._vptr_custom_op._0_4_ = (uint)(local_90 == puVar10);
      MPI_Allreduce(&local_70,&local_88,1,&ompi_mpi_int,&ompi_mpi_op_lor,comm->mpi_comm);
      if ((int)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start == 0) {
        uVar6 = exscan<unsigned_long,std::plus<unsigned_long>>(&local_90,comm,1);
        local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,
                   (long)comm->m_size,(value_type_conflict2 *)&local_88,&local_91);
        uVar1 = comm->m_size;
        uVar2 = comm->m_rank;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = puVar10;
        uVar7 = (ulong)puVar10 / (ulong)uVar1;
        uVar8 = SUB168(auVar3 % ZEXT416(uVar1),0);
        if (local_90 != (pointer)0x0) {
          uVar9 = uVar8 * (uVar7 + 1);
          if (uVar6 < uVar9) {
            iVar5 = (int)(uVar6 / (uVar7 + 1));
          }
          else {
            iVar5 = (int)((uVar6 - uVar9) / uVar7) + SUB164(auVar3 % ZEXT416(uVar1),0);
          }
          if (iVar5 < (int)uVar1) {
            uVar9 = (ulong)iVar5;
            puVar10 = local_90;
            do {
              uVar9 = uVar9 + 1;
              uVar12 = uVar9 & 0xffffffff;
              uVar13 = uVar12;
              if (uVar8 < uVar12) {
                uVar13 = uVar8;
              }
              puVar11 = (pointer)((uVar7 * uVar12 - uVar6) + uVar13);
              if (puVar10 < puVar11) {
                puVar11 = puVar10;
              }
              *(pointer *)
               (CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op) + -8 +
               uVar9 * 8) = puVar11;
              puVar10 = (pointer)((long)puVar10 - (long)puVar11);
            } while ((puVar10 != (pointer)0x0) &&
                    (uVar6 = uVar6 + (long)puVar11, (long)uVar9 < (long)(int)uVar1));
          }
        }
        all2all<unsigned_long>
                  (&local_88,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,comm
                  );
        if (local_90 == (pointer)0x0) {
          begin._M_current = (int *)0x0;
        }
        if (uVar7 == -(ulong)(uVar2 < uVar8)) {
          out._M_current = (int *)0x0;
        }
        all2allv<int>(begin._M_current,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,
                      out._M_current,&local_88,comm);
        if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pvVar4 = (void *)CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,local_70.m_user_func.super__Function_base._M_functor._8_8_ -
                                 (long)pvVar4);
        }
      }
      else {
        impl::
        distribute_scatter<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (begin,end,out,(size_t)puVar10,comm);
      }
    }
  }
  return;
}

Assistant:

void stable_distribute(_InIterator begin, _InIterator end, _OutIterator out, const mxx::comm& comm) {
    // if there's only one process, return a copy
    if (comm.size() == 1) {
        std::copy(begin, end, out);
        return;
    }

    // get local and global size
    size_t local_size = std::distance(begin, end);
    size_t total_size = mxx::allreduce(local_size, comm);

    if (total_size == 0) {
        return;
    }

    // one process has all elements -> use scatter instead of all2all
    if (mxx::any_of(local_size == total_size, comm)) {
        impl::distribute_scatter(begin, end, out, total_size, comm);
    } else {
        // get prefix sum of size and total size
        size_t prefix = mxx::exscan(local_size, comm);

        // calculate where to send elements
        // if there are any elements to send
        std::vector<size_t> send_counts(comm.size(), 0);
        blk_dist part(total_size, comm);
        if (local_size > 0) {
          int first_p = part.rank_of(prefix);
          size_t left_to_send = local_size;
          for (; left_to_send > 0 && first_p < comm.size(); ++first_p) {
              size_t nsend = std::min<size_t>(part.iprefix_size(first_p) - prefix, left_to_send);
              send_counts[first_p] = nsend;
              left_to_send -= nsend;
              prefix += nsend;
          }
        }
        std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
        // TODO: accept iterators in mxx::all2all?
        using SendType = typename std::iterator_traits<_InIterator>::value_type;
        using RecvType = typename std::iterator_traits<_OutIterator>::value_type;
        const SendType* send_buf = (local_size > 0) ? &(*begin) : nullptr;
        RecvType* recv_buf = (part.local_size() > 0) ? &(*out) : nullptr;
        mxx::all2allv(send_buf, send_counts, recv_buf, recv_counts, comm);
    }
}